

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O1

Literal * wasm::Literal::makeFromInt32(Literal *__return_storage_ptr__,int32_t x,Type type)

{
  long lVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 local_78;
  undefined8 local_68;
  undefined4 local_60;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_20;
  
  if (type.id < 7) {
    switch((int)type.id) {
    case 2:
      (__return_storage_ptr__->field_0).i32 = x;
      (__return_storage_ptr__->type).id = 2;
      break;
    case 3:
      *(long *)&__return_storage_ptr__->field_0 = (long)x;
      (__return_storage_ptr__->type).id = 3;
      break;
    case 4:
      *(float *)&__return_storage_ptr__->field_0 = (float)x;
      (__return_storage_ptr__->type).id = 4;
      break;
    case 5:
      *(double *)&__return_storage_ptr__->field_0 = (double)x;
      (__return_storage_ptr__->type).id = 5;
      break;
    case 6:
      local_68 = 2;
      local_60 = 0;
      local_50 = 2;
      local_48 = 0;
      local_38 = 2;
      local_30 = 0;
      local_20 = 2;
      local_78.i32 = x;
      wasm::Literal::Literal(__return_storage_ptr__,(array *)&local_78.func);
      lVar1 = 0x48;
      do {
        wasm::Literal::~Literal((Literal *)((long)&local_78.func.super_IString.str._M_len + lVar1));
        lVar1 = lVar1 + -0x18;
      } while (lVar1 != -0x18);
      break;
    default:
      wasm::handle_unreachable
                ("unexpected type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                 ,0xc3);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("isBasic() && \"Basic type expected\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x1c4,"BasicType wasm::Type::getBasic() const");
}

Assistant:

static Literal makeFromInt32(int32_t x, Type type) {
    switch (type.getBasic()) {
      case Type::i32:
        return Literal(int32_t(x));
      case Type::i64:
        return Literal(int64_t(x));
      case Type::f32:
        return Literal(float(x));
      case Type::f64:
        return Literal(double(x));
      case Type::v128:
        return Literal(std::array<Literal, 4>{{Literal(x),
                                               Literal(int32_t(0)),
                                               Literal(int32_t(0)),
                                               Literal(int32_t(0))}});
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }